

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

int i2c_read_i2c_block_data(int pi,uint handle,uint reg,char *buf,uint32_t count)

{
  int __state;
  int sent;
  uint32_t count_local;
  gpioExtent_t ext [1];
  
  ext[0].ptr = &count_local;
  ext[0].size = 4;
  count_local = count;
  sent = pigpio_command_ext(pi,0x43,handle,reg,4,1,ext,0);
  if (0 < sent) {
    sent = recvMax(pi,buf,count_local,sent);
  }
  __state = gCancelState[pi];
  pthread_mutex_unlock((pthread_mutex_t *)(gCmdMutex + pi));
  pthread_setcancelstate(__state,(int *)0x0);
  return sent;
}

Assistant:

int i2c_read_i2c_block_data(
   int pi, unsigned handle, unsigned reg, char *buf, uint32_t count)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=reg
   p3=4
   ## extension ##
   uint32_t count
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &count;

   bytes = pigpio_command_ext
      (pi, PI_CMD_I2CRI, handle, reg, 4, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, buf, count, bytes);
   }

   _pmu(pi);

   return bytes;
}